

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::runCliqueMerging
          (HighsCliqueTable *this,HighsDomain *globaldomain,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          bool equation)

{
  anon_class_8_1_15f2b025_for__M_pred __pred;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  byte in_CL;
  int __c;
  int __c_00;
  int __c_01;
  CliqueVar *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  undefined8 extraout_RDX_03;
  HighsDomain *in_RSI;
  undefined1 **__s;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDI;
  HighsInt i_5;
  HighsInt newSize_1;
  CliqueVar extvar;
  HighsInt i_4;
  HighsInt newSize;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt sizeWithCandidates;
  anon_class_24_3_c8bba91f addCands;
  HighsInt i_1;
  HighsInt thisNumClqs;
  HighsInt i;
  HighsInt initialCliqueSize;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  HighsInt numcliques;
  CliqueVar extensionstart;
  HighsCliqueTable *in_stack_fffffffffffffd88;
  CliqueVar *in_stack_fffffffffffffd90;
  CliqueVar *in_stack_fffffffffffffd98;
  HighsDomain *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  CliqueVar CVar8;
  const_iterator in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  CliqueVar in_stack_fffffffffffffdc4;
  HighsDomain *in_stack_fffffffffffffeb8;
  iterator in_stack_fffffffffffffec0;
  CliqueVar local_11c;
  iterator in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  HighsCliqueTable *in_stack_fffffffffffffef8;
  CliqueVar local_dc;
  CliqueVar local_9c;
  int local_98;
  undefined1 *local_88;
  undefined1 local_80 [8];
  HighsDomain *local_78;
  CliqueVar *local_70;
  CliqueVar local_64;
  undefined4 local_60;
  value_type local_5c;
  HighsInt local_58;
  CliqueVar local_54;
  CliqueVar local_50;
  int local_24;
  value_type local_20;
  byte local_19;
  CliqueVar *local_18;
  HighsDomain *local_10;
  
  local_19 = in_CL & 1;
  local_24 = 0x7fffffff;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::size
            ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
             (in_RDI + 1));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffdb0._M_current,
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x53becc);
  pcVar2 = (char *)std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::
                   size((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                         *)(in_RDI + 1));
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (size_type)in_stack_fffffffffffffdb8._M_current);
  sVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               local_18);
  local_50 = SUB84(sVar3,0);
  uVar7 = extraout_RDX;
  for (local_54 = (CliqueVar)0x0; local_54 != local_50; local_54 = (CliqueVar)((int)local_54 + 1)) {
    pvVar4 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](in_RDI,(long)(int)local_54);
    pcVar2 = (char *)(ulong)((uint)*pvVar4 & 0x7fffffff);
    bVar1 = HighsDomain::isFixed
                      (in_stack_fffffffffffffda0,
                       (HighsInt)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    uVar7 = extraout_RDX_00;
    if (!bVar1) {
      pvVar4 = std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)local_18,(long)(int)local_54);
      local_5c = *pvVar4;
      pcVar2 = (char *)(ulong)(uint)local_5c;
      local_58 = numCliques(in_stack_fffffffffffffd88,
                            SUB84((ulong)in_stack_fffffffffffffd90 >> 0x20,0));
      uVar7 = extraout_RDX_01;
      if (local_58 < local_24) {
        pcVar2 = (char *)(long)(int)local_54;
        local_24 = local_58;
        pvVar4 = std::
                 vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                 operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             *)local_18,(size_type)pcVar2);
        local_20 = *pvVar4;
        uVar7 = extraout_RDX_02;
      }
    }
  }
  if (local_24 == 0x7fffffff) {
    std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::clear
              ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x53c050);
    local_60 = 1;
  }
  else {
    for (local_64 = (CliqueVar)0x0; local_64 != local_50; local_64 = (CliqueVar)((int)local_64 + 1))
    {
      pcVar2 = (char *)(long)(int)local_64;
      pvVar4 = std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)local_18,(size_type)pcVar2);
      pcVar2 = CliqueVar::index(pvVar4,pcVar2,__c);
      pcVar2 = (char *)(long)(int)pcVar2;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in_RDI[0xe].
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pcVar2);
      *pvVar5 = '\x01';
      uVar7 = extraout_RDX_03;
    }
    local_78 = local_10;
    local_70 = local_18;
    pcVar2 = CliqueVar::index(&local_20,pcVar2,(int)uVar7);
    std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
              ((vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *)
               (in_RDI + 1),(long)(int)pcVar2);
    local_88 = local_80;
    __s = &local_88;
    HighsHashTree<int,int>::
    for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__0>
              ((HighsHashTree<int,_int> *)in_stack_fffffffffffffd90,
               (anon_class_8_1_9cafd1bc *)in_stack_fffffffffffffd88);
    pcVar2 = CliqueVar::index(&local_20,(char *)__s,__c_00);
    std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::operator[]
              ((vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *)
               (in_RDI + 2),(long)(int)pcVar2);
    HighsHashTree<int,void>::
    for_each<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__1>
              ((HighsHashTree<int,_void> *)in_stack_fffffffffffffd90,
               (anon_class_8_1_9cafd1bc *)in_stack_fffffffffffffd88);
    sVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)local_18);
    for (local_98 = 0; local_98 != (int)sVar3; local_98 = local_98 + 1) {
      pcVar2 = (char *)(long)local_98;
      pvVar4 = std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)local_18,(size_type)pcVar2);
      pcVar2 = CliqueVar::index(pvVar4,pcVar2,__c_01);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in_RDI[0xe].
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)pcVar2);
      *pvVar5 = '\0';
    }
    local_9c = (CliqueVar)0x0;
    while( true ) {
      CVar8 = local_50;
      bVar1 = false;
      if (local_9c != local_50) {
        sVar3 = std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)local_18);
        bVar1 = (int)CVar8 < (int)sVar3;
      }
      if (!bVar1) break;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)local_18,(long)(int)local_9c);
      bVar1 = CliqueVar::operator==
                        (in_stack_fffffffffffffd90,(CliqueVar *)in_stack_fffffffffffffd88);
      if (!bVar1) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18,(long)(int)local_9c);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)0x53c35e);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18);
        shrinkToNeighbourhood
                  ((HighsCliqueTable *)in_stack_fffffffffffffdb8._M_current,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0._M_current,
                   (int64_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffdc4,(CliqueVar *)in_stack_fffffffffffffda0,
                   (HighsInt)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffd88->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffd98,(difference_type)in_stack_fffffffffffffd90);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd90,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  (&in_stack_fffffffffffffd88->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd90,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
              (const_iterator)in_stack_fffffffffffffdb8._M_current,in_stack_fffffffffffffdb0);
      }
      local_9c = (CliqueVar)((int)local_9c + 1);
    }
    uVar6 = (ulong)(int)local_50;
    sVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)local_18);
    if (uVar6 < sVar3) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x53c4e0);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)local_18);
      HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                ((HighsRandom *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (HighsInt)((ulong)in_stack_fffffffffffffd90 >> 0x20));
      local_dc = local_50;
      while (sVar3 = std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             *)local_18), (int)local_dc < (int)sVar3) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18,(long)(int)local_dc);
        local_dc = (CliqueVar)((int)local_dc + 1);
        in_stack_fffffffffffffdc4 = local_dc;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)0x53c5bc);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
                  ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18);
        shrinkToNeighbourhood
                  ((HighsCliqueTable *)in_stack_fffffffffffffdb8._M_current,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0._M_current,
                   (int64_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffdc4,(CliqueVar *)in_stack_fffffffffffffda0,
                   (HighsInt)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        in_stack_fffffffffffffdb0._M_current = local_18;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffd88->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffd98,(difference_type)in_stack_fffffffffffffd90);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd90,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffef0 =
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::end(&in_stack_fffffffffffffd88->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd90,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffdb8 =
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffdb8._M_current,in_stack_fffffffffffffdb0);
        in_stack_fffffffffffffee8 = in_stack_fffffffffffffdb8;
      }
    }
    if ((local_19 & 1) == 0) {
      runCliqueSubsumption
                (in_stack_fffffffffffffef8,(HighsDomain *)in_stack_fffffffffffffef0._M_current,
                 (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)in_stack_fffffffffffffee8._M_current);
      bVar1 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::empty((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       *)in_stack_fffffffffffffda0);
      if (!bVar1) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffd88->cliqueentries);
        in_stack_fffffffffffffec0 =
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::end(&in_stack_fffffffffffffd88->cliqueentries);
        __pred.globaldomain._4_4_ = in_stack_fffffffffffffdac;
        __pred.globaldomain._0_4_ = in_stack_fffffffffffffda8;
        std::
        remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__2>
                  ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )in_stack_fffffffffffffdb8._M_current,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )in_stack_fffffffffffffdb0._M_current,__pred);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)local_18,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  (&in_stack_fffffffffffffd88->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)local_18,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd88);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        erase((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
              CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
              (const_iterator)in_stack_fffffffffffffdb8._M_current,in_stack_fffffffffffffdb0);
        in_stack_fffffffffffffeb8 = local_10;
      }
    }
    else {
      local_11c = local_50;
      while (CVar8 = local_11c,
            sVar3 = std::
                    vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)local_18), (int)CVar8 < (int)sVar3) {
        in_stack_fffffffffffffda0 = local_10;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18,(long)(int)local_11c);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[]((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)local_18,(long)(int)local_11c);
        vertexInfeasible((HighsCliqueTable *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (HighsDomain *)in_stack_fffffffffffffdb8._M_current,
                         (HighsInt)((ulong)in_stack_fffffffffffffdb0._M_current >> 0x20),
                         (HighsInt)in_stack_fffffffffffffdb0._M_current);
        local_11c = (CliqueVar)((int)local_11c + 1);
      }
    }
    processInfeasibleVertices
              ((HighsCliqueTable *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffeb8);
    local_60 = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0);
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain,
                                        std::vector<CliqueVar>& clique,
                                        bool equation) {
  CliqueVar extensionstart;
  HighsInt numcliques = kHighsIInf;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  HighsInt initialCliqueSize = clique.size();
  for (HighsInt i = 0; i != initialCliqueSize; ++i) {
    if (globaldomain.isFixed(cliqueentries[i].col)) continue;

    HighsInt thisNumClqs = numCliques(clique[i]);
    if (thisNumClqs < numcliques) {
      numcliques = thisNumClqs;
      extensionstart = clique[i];
    }
  }

  if (numcliques == kHighsIInf) {
    clique.clear();
    return;
  }

  for (HighsInt i = 0; i != initialCliqueSize; ++i)
    iscandidate[clique[i].index()] = true;

  auto addCands = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (iscandidate[cliqueentries[i].index()] ||
          globaldomain.isFixed(cliqueentries[i].col))
        continue;

      iscandidate[cliqueentries[i].index()] = true;
      clique.push_back(cliqueentries[i]);
    }
  };

  invertedHashList[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  invertedHashListSizeTwo[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  HighsInt sizeWithCandidates = clique.size();
  for (HighsInt i = 0; i != sizeWithCandidates; ++i)
    iscandidate[clique[i].index()] = false;

  for (HighsInt i = 0;
       i != initialCliqueSize && initialCliqueSize < (HighsInt)clique.size();
       ++i) {
    if (clique[i] == extensionstart) continue;

    HighsInt newSize =
        initialCliqueSize +
        shrinkToNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries,
                              clique[i], clique.data() + initialCliqueSize,
                              clique.size() - initialCliqueSize);
    clique.erase(clique.begin() + newSize, clique.end());
  }

  if (static_cast<size_t>(initialCliqueSize) < clique.size()) {
    // todo, shuffle extension vars?
    randgen.shuffle(clique.data() + initialCliqueSize,
                    clique.size() - initialCliqueSize);
    HighsInt i = initialCliqueSize;
    while (i < (HighsInt)clique.size()) {
      CliqueVar extvar = clique[i];
      i += 1;

      HighsInt newSize = i + shrinkToNeighbourhood(
                                 neighbourhoodInds, numNeighbourhoodQueries,
                                 extvar, clique.data() + i, clique.size() - i);
      clique.erase(clique.begin() + newSize, clique.end());
    }
  }

  if (equation) {
    for (HighsInt i = initialCliqueSize; i < (HighsInt)clique.size(); ++i)
      vertexInfeasible(globaldomain, clique[i].col, clique[i].val);
  } else {
    runCliqueSubsumption(globaldomain, clique);

    if (!clique.empty()) {
      clique.erase(
          std::remove_if(clique.begin(), clique.end(),
                         [&](CliqueVar v) {
                           return globaldomain.isFixed(v.col) &&
                                  static_cast<int>(
                                      globaldomain.col_lower_[v.col]) ==
                                      static_cast<int>(1 - v.val);
                         }),
          clique.end());
    }
  }

  processInfeasibleVertices(globaldomain);
}